

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O1

FaceIter __thiscall CMU462::HalfedgeMesh::bevelFace(HalfedgeMesh *this,FaceIter f)

{
  size_t *psVar1;
  long lVar2;
  undefined8 uVar3;
  _List_node_base *p_Var4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  HalfedgeIter h;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  inside_halfedge;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  inside_twin_halfedge;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  inward_halfedge;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  outward_halfedge;
  vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  new_vertex;
  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  connectingEdge;
  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  innerEdge;
  vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
  sideFace;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  old_halfedge;
  vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  old_vertex;
  _List_iterator<CMU462::Face> local_1b0;
  ulong local_1a8;
  list<CMU462::Edge,_std::allocator<CMU462::Edge>_> *local_1a0;
  _List_iterator<CMU462::Halfedge> local_198;
  _List_node_base *local_190;
  undefined8 *local_188;
  iterator iStack_180;
  _List_iterator<CMU462::Halfedge> *local_178;
  void *local_168;
  iterator iStack_160;
  _List_iterator<CMU462::Halfedge> *local_158;
  void *local_148;
  iterator iStack_140;
  _List_iterator<CMU462::Halfedge> *local_138;
  void *local_128;
  iterator iStack_120;
  _List_iterator<CMU462::Halfedge> *local_118;
  void *local_108;
  iterator iStack_100;
  _List_iterator<CMU462::Vertex> *local_f8;
  void *local_e8;
  iterator iStack_e0;
  _List_iterator<CMU462::Edge> *local_d8;
  void *local_c8;
  iterator iStack_c0;
  _List_iterator<CMU462::Edge> *local_b8;
  void *local_a8;
  iterator iStack_a0;
  _List_iterator<CMU462::Face> *local_98;
  void *local_88;
  iterator iStack_80;
  _List_iterator<CMU462::Halfedge> *local_78;
  list<CMU462::Edge,_std::allocator<CMU462::Edge>_> *local_68;
  iterator iStack_60;
  _List_iterator<CMU462::Vertex> *local_58;
  long local_48;
  long local_40;
  long local_38;
  
  local_198._M_node = f._M_node[0xb]._M_prev;
  uVar6 = 1;
  p_Var4 = local_198._M_node;
  lVar11 = 0;
  do {
    lVar10 = lVar11;
    local_1a8 = (ulong)uVar6;
    lVar11 = lVar10 + 1;
    p_Var4 = p_Var4[2]._M_next;
    uVar6 = uVar6 + 1;
  } while (local_198._M_node != p_Var4);
  local_68 = (list<CMU462::Edge,_std::allocator<CMU462::Edge>_> *)0x0;
  iStack_60._M_current = (_List_iterator<CMU462::Vertex> *)0x0;
  local_58 = (_List_iterator<CMU462::Vertex> *)0x0;
  local_78 = (_List_iterator<CMU462::Halfedge> *)0x0;
  local_88 = (void *)0x0;
  iStack_80._M_current = (_List_iterator<CMU462::Halfedge> *)0x0;
  local_190 = f._M_node;
  do {
    if (iStack_60._M_current == local_58) {
      std::
      vector<std::_List_iterator<CMU462::Vertex>,std::allocator<std::_List_iterator<CMU462::Vertex>>>
      ::_M_realloc_insert<std::_List_iterator<CMU462::Vertex>const&>
                ((vector<std::_List_iterator<CMU462::Vertex>,std::allocator<std::_List_iterator<CMU462::Vertex>>>
                  *)&local_68,iStack_60,
                 (_List_iterator<CMU462::Vertex> *)&local_198._M_node[2]._M_prev);
    }
    else {
      (iStack_60._M_current)->_M_node = local_198._M_node[2]._M_prev;
      iStack_60._M_current = iStack_60._M_current + 1;
    }
    if (iStack_80._M_current == local_78) {
      std::
      vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
      ::_M_realloc_insert<std::_List_iterator<CMU462::Halfedge>const&>
                ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                  *)&local_88,iStack_80,&local_198);
    }
    else {
      (iStack_80._M_current)->_M_node = local_198._M_node;
      iStack_80._M_current = iStack_80._M_current + 1;
    }
    local_198._M_node = local_198._M_node[2]._M_next;
  } while (local_190[0xb]._M_prev != local_198._M_node);
  local_a8 = (void *)0x0;
  iStack_a0._M_current = (_List_iterator<CMU462::Face> *)0x0;
  local_98 = (_List_iterator<CMU462::Face> *)0x0;
  local_b8 = (_List_iterator<CMU462::Edge> *)0x0;
  local_c8 = (void *)0x0;
  iStack_c0._M_current = (_List_iterator<CMU462::Edge> *)0x0;
  local_d8 = (_List_iterator<CMU462::Edge> *)0x0;
  local_e8 = (void *)0x0;
  iStack_e0._M_current = (_List_iterator<CMU462::Edge> *)0x0;
  local_f8 = (_List_iterator<CMU462::Vertex> *)0x0;
  local_108 = (void *)0x0;
  iStack_100._M_current = (_List_iterator<CMU462::Vertex> *)0x0;
  local_118 = (_List_iterator<CMU462::Halfedge> *)0x0;
  local_128 = (void *)0x0;
  iStack_120._M_current = (_List_iterator<CMU462::Halfedge> *)0x0;
  local_138 = (_List_iterator<CMU462::Halfedge> *)0x0;
  local_148 = (void *)0x0;
  iStack_140._M_current = (_List_iterator<CMU462::Halfedge> *)0x0;
  local_178 = (_List_iterator<CMU462::Halfedge> *)0x0;
  local_188 = (undefined8 *)0x0;
  iStack_180._M_current = (_List_iterator<CMU462::Halfedge> *)0x0;
  local_158 = (_List_iterator<CMU462::Halfedge> *)0x0;
  local_168 = (void *)0x0;
  iStack_160._M_current = (_List_iterator<CMU462::Halfedge> *)0x0;
  iVar9 = (int)lVar11;
  if (0 < iVar9) {
    local_1a0 = &this->edges;
    uVar12 = local_1a8 & 0xffffffff;
    do {
      local_1b0._M_node = (_List_node_base *)newFace(this);
      if (iStack_a0._M_current == local_98) {
        std::
        vector<std::_List_iterator<CMU462::Face>,std::allocator<std::_List_iterator<CMU462::Face>>>
        ::_M_realloc_insert<std::_List_iterator<CMU462::Face>>
                  ((vector<std::_List_iterator<CMU462::Face>,std::allocator<std::_List_iterator<CMU462::Face>>>
                    *)&local_a8,iStack_a0,&local_1b0);
      }
      else {
        (iStack_a0._M_current)->_M_node = local_1b0._M_node;
        iStack_a0._M_current = iStack_a0._M_current + 1;
      }
      p_Var4 = (_List_node_base *)operator_new(0x70);
      p_Var4[1]._M_next = (_List_node_base *)&PTR_centroid_00271dd8;
      p_Var4[4]._M_next = (_List_node_base *)0x0;
      p_Var4[4]._M_prev = (_List_node_base *)0x0;
      p_Var4[5]._M_next = (_List_node_base *)0x0;
      p_Var4[5]._M_prev = (_List_node_base *)0x0;
      p_Var4[6]._M_next = (_List_node_base *)0x0;
      p_Var4[6]._M_prev = (_List_node_base *)0x0;
      p_Var4[1]._M_prev = (_List_node_base *)0x0;
      p_Var4[2]._M_next = (_List_node_base *)0x0;
      p_Var4[2]._M_prev = (_List_node_base *)0x0;
      p_Var4[3]._M_next = (_List_node_base *)0x0;
      *(undefined1 *)&p_Var4[3]._M_prev = 0;
      std::__detail::_List_node_base::_M_hook(p_Var4);
      psVar1 = &(this->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 + 1;
      local_1b0._M_node = p_Var4;
      if (iStack_c0._M_current == local_b8) {
        std::
        vector<std::_List_iterator<CMU462::Edge>,std::allocator<std::_List_iterator<CMU462::Edge>>>
        ::_M_realloc_insert<std::_List_iterator<CMU462::Edge>>
                  ((vector<std::_List_iterator<CMU462::Edge>,std::allocator<std::_List_iterator<CMU462::Edge>>>
                    *)&local_c8,iStack_c0,(_List_iterator<CMU462::Edge> *)&local_1b0);
      }
      else {
        (iStack_c0._M_current)->_M_node = p_Var4;
        iStack_c0._M_current = iStack_c0._M_current + 1;
      }
      p_Var4 = (_List_node_base *)operator_new(0x70);
      p_Var4[1]._M_next = (_List_node_base *)&PTR_centroid_00271dd8;
      p_Var4[4]._M_next = (_List_node_base *)0x0;
      p_Var4[4]._M_prev = (_List_node_base *)0x0;
      p_Var4[5]._M_next = (_List_node_base *)0x0;
      p_Var4[5]._M_prev = (_List_node_base *)0x0;
      p_Var4[6]._M_next = (_List_node_base *)0x0;
      p_Var4[6]._M_prev = (_List_node_base *)0x0;
      p_Var4[1]._M_prev = (_List_node_base *)0x0;
      p_Var4[2]._M_next = (_List_node_base *)0x0;
      p_Var4[2]._M_prev = (_List_node_base *)0x0;
      p_Var4[3]._M_next = (_List_node_base *)0x0;
      *(undefined1 *)&p_Var4[3]._M_prev = 0;
      std::__detail::_List_node_base::_M_hook(p_Var4);
      psVar1 = &(this->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 + 1;
      local_1b0._M_node = p_Var4;
      if (iStack_e0._M_current == local_d8) {
        std::
        vector<std::_List_iterator<CMU462::Edge>,std::allocator<std::_List_iterator<CMU462::Edge>>>
        ::_M_realloc_insert<std::_List_iterator<CMU462::Edge>>
                  ((vector<std::_List_iterator<CMU462::Edge>,std::allocator<std::_List_iterator<CMU462::Edge>>>
                    *)&local_e8,iStack_e0,(_List_iterator<CMU462::Edge> *)&local_1b0);
      }
      else {
        (iStack_e0._M_current)->_M_node = p_Var4;
        iStack_e0._M_current = iStack_e0._M_current + 1;
      }
      local_1b0._M_node = (_List_node_base *)newVertex(this);
      if (iStack_100._M_current == local_f8) {
        std::
        vector<std::_List_iterator<CMU462::Vertex>,std::allocator<std::_List_iterator<CMU462::Vertex>>>
        ::_M_realloc_insert<std::_List_iterator<CMU462::Vertex>>
                  ((vector<std::_List_iterator<CMU462::Vertex>,std::allocator<std::_List_iterator<CMU462::Vertex>>>
                    *)&local_108,iStack_100,(_List_iterator<CMU462::Vertex> *)&local_1b0);
      }
      else {
        (iStack_100._M_current)->_M_node = local_1b0._M_node;
        iStack_100._M_current = iStack_100._M_current + 1;
      }
      p_Var4 = (_List_node_base *)operator_new(0x40);
      p_Var4[1]._M_next = (_List_node_base *)&PTR_centroid_00271d18;
      p_Var4[1]._M_prev = (_List_node_base *)0x0;
      p_Var4[2]._M_next = (_List_node_base *)0x0;
      p_Var4[2]._M_prev = (_List_node_base *)0x0;
      p_Var4[3]._M_next = (_List_node_base *)0x0;
      p_Var4[3]._M_prev = (_List_node_base *)0x0;
      std::__detail::_List_node_base::_M_hook(p_Var4);
      psVar1 = &(this->halfedges).
                super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 + 1;
      local_1b0._M_node = p_Var4;
      if (iStack_120._M_current == local_118) {
        std::
        vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
        ::_M_realloc_insert<std::_List_iterator<CMU462::Halfedge>>
                  ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                    *)&local_128,iStack_120,(_List_iterator<CMU462::Halfedge> *)&local_1b0);
      }
      else {
        (iStack_120._M_current)->_M_node = p_Var4;
        iStack_120._M_current = iStack_120._M_current + 1;
      }
      p_Var4 = (_List_node_base *)operator_new(0x40);
      p_Var4[1]._M_next = (_List_node_base *)&PTR_centroid_00271d18;
      p_Var4[1]._M_prev = (_List_node_base *)0x0;
      p_Var4[2]._M_next = (_List_node_base *)0x0;
      p_Var4[2]._M_prev = (_List_node_base *)0x0;
      p_Var4[3]._M_next = (_List_node_base *)0x0;
      p_Var4[3]._M_prev = (_List_node_base *)0x0;
      std::__detail::_List_node_base::_M_hook(p_Var4);
      psVar1 = &(this->halfedges).
                super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 + 1;
      local_1b0._M_node = p_Var4;
      if (iStack_140._M_current == local_138) {
        std::
        vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
        ::_M_realloc_insert<std::_List_iterator<CMU462::Halfedge>>
                  ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                    *)&local_148,iStack_140,(_List_iterator<CMU462::Halfedge> *)&local_1b0);
      }
      else {
        (iStack_140._M_current)->_M_node = p_Var4;
        iStack_140._M_current = iStack_140._M_current + 1;
      }
      p_Var4 = (_List_node_base *)operator_new(0x40);
      p_Var4[1]._M_next = (_List_node_base *)&PTR_centroid_00271d18;
      p_Var4[1]._M_prev = (_List_node_base *)0x0;
      p_Var4[2]._M_next = (_List_node_base *)0x0;
      p_Var4[2]._M_prev = (_List_node_base *)0x0;
      p_Var4[3]._M_next = (_List_node_base *)0x0;
      p_Var4[3]._M_prev = (_List_node_base *)0x0;
      std::__detail::_List_node_base::_M_hook(p_Var4);
      psVar1 = &(this->halfedges).
                super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 + 1;
      local_1b0._M_node = p_Var4;
      if (iStack_180._M_current == local_178) {
        std::
        vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
        ::_M_realloc_insert<std::_List_iterator<CMU462::Halfedge>>
                  ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                    *)&local_188,iStack_180,(_List_iterator<CMU462::Halfedge> *)&local_1b0);
      }
      else {
        (iStack_180._M_current)->_M_node = p_Var4;
        iStack_180._M_current = iStack_180._M_current + 1;
      }
      p_Var4 = (_List_node_base *)operator_new(0x40);
      p_Var4[1]._M_next = (_List_node_base *)&PTR_centroid_00271d18;
      p_Var4[1]._M_prev = (_List_node_base *)0x0;
      p_Var4[2]._M_next = (_List_node_base *)0x0;
      p_Var4[2]._M_prev = (_List_node_base *)0x0;
      p_Var4[3]._M_next = (_List_node_base *)0x0;
      p_Var4[3]._M_prev = (_List_node_base *)0x0;
      std::__detail::_List_node_base::_M_hook(p_Var4);
      psVar1 = &(this->halfedges).
                super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 + 1;
      local_1b0._M_node = p_Var4;
      if (iStack_160._M_current == local_158) {
        std::
        vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
        ::_M_realloc_insert<std::_List_iterator<CMU462::Halfedge>>
                  ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                    *)&local_168,iStack_160,(_List_iterator<CMU462::Halfedge> *)&local_1b0);
      }
      else {
        (iStack_160._M_current)->_M_node = p_Var4;
        iStack_160._M_current = iStack_160._M_current + 1;
      }
      uVar6 = (int)uVar12 - 1;
      uVar12 = (ulong)uVar6;
    } while (uVar6 != 0);
  }
  p_Var4 = local_190;
  if (0 < iVar9) {
    local_1a0 = local_68;
    uVar7 = local_1a8 & 0xffffffff;
    local_48 = -uVar7;
    local_1a8 = (ulong)((uint)local_1a8 & 0x7fffffff);
    uVar12 = 1;
    do {
      lVar8 = *(long *)((long)local_68 + uVar12 * 8 + -8);
      lVar2 = *(long *)((long)local_108 + uVar12 * 8 + -8);
      *(undefined8 *)(lVar2 + 0x28) = *(undefined8 *)(lVar8 + 0x28);
      uVar3 = *(undefined8 *)(lVar8 + 0x20);
      *(undefined8 *)(lVar2 + 0x18) = *(undefined8 *)(lVar8 + 0x18);
      *(undefined8 *)(lVar2 + 0x20) = uVar3;
      *(undefined8 *)(*(long *)((long)local_68 + uVar12 * 8 + -8) + 0xf8) =
           *(undefined8 *)((long)local_148 + uVar12 * 8 + -8);
      *(undefined8 *)(*(long *)((long)local_148 + uVar12 * 8 + -8) + 0x28) =
           *(undefined8 *)((long)local_68 + uVar12 * 8 + -8);
      *(undefined8 *)(*(long *)((long)local_108 + uVar12 * 8 + -8) + 0xf8) =
           *(undefined8 *)((long)local_128 + uVar12 * 8 + -8);
      *(undefined8 *)(*(long *)((long)local_128 + uVar12 * 8 + -8) + 0x28) =
           *(undefined8 *)((long)local_108 + uVar12 * 8 + -8);
      uVar5 = uVar12;
      if (local_1a8 == uVar12) {
        uVar5 = 0;
      }
      *(undefined8 *)(*(long *)((long)local_168 + uVar12 * 8 + -8) + 0x28) =
           *(undefined8 *)((long)local_108 + uVar5 * 8);
      *(undefined8 *)(local_188[uVar12 - 1] + 0x28) =
           *(undefined8 *)((long)local_108 + uVar12 * 8 + -8);
      *(undefined8 *)(*(long *)((long)local_128 + uVar12 * 8 + -8) + 0x18) =
           *(undefined8 *)((long)local_148 + uVar12 * 8 + -8);
      *(undefined8 *)(*(long *)((long)local_148 + uVar12 * 8 + -8) + 0x18) =
           *(undefined8 *)((long)local_128 + uVar12 * 8 + -8);
      *(undefined8 *)(local_188[uVar12 - 1] + 0x18) =
           *(undefined8 *)((long)local_168 + uVar12 * 8 + -8);
      *(undefined8 *)(*(long *)((long)local_168 + uVar12 * 8 + -8) + 0x18) = local_188[uVar12 - 1];
      *(undefined8 *)(*(long *)((long)local_128 + uVar12 * 8 + -8) + 0x38) =
           *(undefined8 *)((long)local_a8 + uVar12 * 8 + -8);
      lVar8 = (long)(((int)lVar10 + (int)uVar12 + -1) % iVar9);
      *(undefined8 *)(*(long *)((long)local_148 + uVar12 * 8 + -8) + 0x38) =
           *(undefined8 *)((long)local_a8 + lVar8 * 8);
      *(undefined8 *)(*(long *)((long)local_168 + uVar12 * 8 + -8) + 0x38) =
           *(undefined8 *)((long)local_a8 + uVar12 * 8 + -8);
      *(undefined8 *)(*(long *)((long)local_88 + uVar12 * 8 + -8) + 0x38) =
           *(undefined8 *)((long)local_a8 + uVar12 * 8 + -8);
      *(undefined8 *)(*(long *)((long)local_a8 + uVar12 * 8 + -8) + 0xb8) =
           *(undefined8 *)((long)local_88 + uVar12 * 8 + -8);
      *(_List_node_base **)(local_188[uVar12 - 1] + 0x38) = local_190;
      *(undefined8 *)(local_188[uVar12 - 1] + 0x30) =
           *(undefined8 *)((long)local_c8 + uVar12 * 8 + -8);
      *(undefined8 *)(*(long *)((long)local_168 + uVar12 * 8 + -8) + 0x30) =
           *(undefined8 *)((long)local_c8 + uVar12 * 8 + -8);
      *(undefined8 *)(*(long *)((long)local_c8 + uVar12 * 8 + -8) + 0x68) = local_188[uVar12 - 1];
      *(undefined8 *)(*(long *)((long)local_128 + uVar12 * 8 + -8) + 0x30) =
           *(undefined8 *)((long)local_e8 + uVar12 * 8 + -8);
      *(undefined8 *)(*(long *)((long)local_148 + uVar12 * 8 + -8) + 0x30) =
           *(undefined8 *)((long)local_e8 + uVar12 * 8 + -8);
      *(undefined8 *)(*(long *)((long)local_e8 + uVar12 * 8 + -8) + 0x68) =
           *(undefined8 *)((long)local_148 + uVar12 * 8 + -8);
      *(undefined8 *)(*(long *)((long)local_88 + uVar12 * 8 + -8) + 0x20) =
           *(undefined8 *)((long)local_148 + uVar5 * 8);
      *(undefined8 *)(*(long *)((long)local_148 + uVar12 * 8 + -8) + 0x20) =
           *(undefined8 *)((long)local_168 + lVar8 * 8);
      *(undefined8 *)(*(long *)((long)local_168 + uVar12 * 8 + -8) + 0x20) =
           *(undefined8 *)((long)local_128 + uVar12 * 8 + -8);
      *(undefined8 *)(*(long *)((long)local_128 + uVar12 * 8 + -8) + 0x20) =
           *(undefined8 *)((long)local_88 + uVar12 * 8 + -8);
      *(undefined8 *)(local_188[uVar12 - 1] + 0x20) = local_188[uVar5];
      bVar13 = uVar12 != uVar7;
      uVar12 = uVar12 + 1;
      local_40 = lVar10;
      local_38 = lVar11;
    } while (bVar13);
  }
  local_190[0xb]._M_prev = (_List_node_base *)*local_188;
  if (local_168 != (void *)0x0) {
    operator_delete(local_168);
  }
  if (local_188 != (undefined8 *)0x0) {
    operator_delete(local_188);
  }
  if (local_148 != (void *)0x0) {
    operator_delete(local_148);
  }
  if (local_128 != (void *)0x0) {
    operator_delete(local_128);
  }
  if (local_108 != (void *)0x0) {
    operator_delete(local_108);
  }
  if (local_e8 != (void *)0x0) {
    operator_delete(local_e8);
  }
  if (local_c8 != (void *)0x0) {
    operator_delete(local_c8);
  }
  if (local_a8 != (void *)0x0) {
    operator_delete(local_a8);
  }
  if (local_88 != (void *)0x0) {
    operator_delete(local_88);
  }
  if (local_68 != (list<CMU462::Edge,_std::allocator<CMU462::Edge>_> *)0x0) {
    operator_delete(local_68);
  }
  return (FaceIter)p_Var4;
}

Assistant:

FaceIter HalfedgeMesh::bevelFace(FaceIter f) {
	// TODO This method should replace the face f with an additional, inset face
	// (and ring of faces around it), corresponding to a bevel operation. It
	// should return the new face.  NOTE: This method is responsible for updating
	// the *connectivity* of the mesh only---it does not need to update the vertex
	// positions.  These positions will be updated in
	// HalfedgeMesh::bevelFaceComputeNewPositions (which you also have to
	// implement!)

	int n = f->degree();
	vector<VertexIter> old_vertex;
	vector<HalfedgeIter> old_halfedge;
	HalfedgeIter h = f->halfedge();
	do {
		old_vertex.push_back(h->vertex());
		old_halfedge.push_back(h);
		h = h->next();
	} while (h != f->halfedge());

	FaceIter new_face = f;
	vector<FaceIter> sideFace;
	vector<EdgeIter> innerEdge;
	vector<EdgeIter> connectingEdge;
	vector<VertexIter> new_vertex;
	vector<HalfedgeIter> outward_halfedge;
	vector<HalfedgeIter> inward_halfedge;
	vector<HalfedgeIter> inside_halfedge;
	vector<HalfedgeIter> inside_twin_halfedge;

	for (int i = 0; i < n; i++) {
		sideFace.push_back(newFace());
		innerEdge.push_back(newEdge());
		connectingEdge.push_back(newEdge());
		new_vertex.push_back(newVertex());
		outward_halfedge.push_back(newHalfedge());
		inward_halfedge.push_back(newHalfedge());
		inside_halfedge.push_back(newHalfedge());
		inside_twin_halfedge.push_back(newHalfedge());
	}

	int i_plus_1, i_minus_1;
	for (int i = 0; i < n; i++) {
		i_plus_1 = (i + 1) % n;
		i_minus_1 = (i - 1 + n) % n;

		new_vertex[i]->position = old_vertex[i]->position;

		old_vertex[i]->halfedge() = inward_halfedge[i];
		inward_halfedge[i]->vertex() = old_vertex[i];
		new_vertex[i]->halfedge() = outward_halfedge[i];
		outward_halfedge[i]->vertex() = new_vertex[i];
		inside_twin_halfedge[i]->vertex() = new_vertex[i_plus_1];
		inside_halfedge[i]->vertex() = new_vertex[i];

		outward_halfedge[i]->twin() = inward_halfedge[i];
		inward_halfedge[i]->twin() = outward_halfedge[i];
		inside_halfedge[i]->twin() = inside_twin_halfedge[i];
		inside_twin_halfedge[i]->twin() = inside_halfedge[i];
		
		outward_halfedge[i]->face() = sideFace[i];
		inward_halfedge[i]->face() = sideFace[i_minus_1];
		inside_twin_halfedge[i]->face() = sideFace[i];
		old_halfedge[i]->face() = sideFace[i];
		sideFace[i]->halfedge() = old_halfedge[i];
		inside_halfedge[i]->face() = new_face;
		
		inside_halfedge[i]->edge() = innerEdge[i];
		inside_twin_halfedge[i]->edge() = innerEdge[i];
		innerEdge[i]->halfedge() = inside_halfedge[i];

		outward_halfedge[i]->edge() = connectingEdge[i];
		inward_halfedge[i]->edge() = connectingEdge[i];
		connectingEdge[i]->halfedge() = inward_halfedge[i];

		old_halfedge[i]->next() = inward_halfedge[i_plus_1];
		inward_halfedge[i]->next() = inside_twin_halfedge[i_minus_1];
		inside_twin_halfedge[i]->next() = outward_halfedge[i];
		outward_halfedge[i]->next() = old_halfedge[i];
		inside_halfedge[i]->next() = inside_halfedge[i_plus_1];
	}
	new_face->halfedge() = inside_halfedge[0];
	//showError("bevelFace() not implemented.");
	return new_face;
}